

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

void __thiscall
vkt::sr::ShaderRenderCaseInstance::useSampler
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,deUint32 textureId)

{
  TextureFormat *pTVar1;
  Type textureType;
  VkSampleCountFlagBits VVar2;
  ChannelOrder CVar3;
  ChannelType CVar4;
  TextureBinding *pTVar5;
  Texture1D *pTVar6;
  undefined8 uVar7;
  Parameters textureParams;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  deUint32 dVar12;
  int iVar13;
  uint uVar14;
  InternalError *this_00;
  deUint32 layerOffset;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  Parameters *pPVar18;
  deUint32 mipLevels;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  TextureFormat texFormat;
  TextureData textureData;
  ConstPixelBufferAccess layerData;
  deUint32 local_e0;
  TextureFormat local_b8;
  ShaderRenderCaseInstance *local_b0;
  vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
  local_a8;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined8 uStack_74;
  UVec3 local_64;
  ConstPixelBufferAccess local_58;
  
  pTVar5 = (this->m_textures).
           super__Vector_base<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
           ._M_impl.super__Vector_impl_data._M_start[textureId].m_ptr;
  textureType = pTVar5->m_type;
  VVar2 = (pTVar5->m_params).samples;
  local_b8.order = CHANNELORDER_LAST;
  local_b8.type = CHANNELTYPE_LAST;
  local_a8.
  super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(textureType) {
  case TYPE_1D:
    pTVar6 = (pTVar5->m_binding).tex1D;
    local_b8 = (pTVar6->super_TextureLevelPyramid).m_format;
    mipLevels = 1;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      mipLevels = (int)((ulong)((long)*(pointer *)
                                       ((long)&(pTVar6->super_TextureLevelPyramid).m_access + 8) -
                               *(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                         ._M_impl) >> 3) * -0x33333333;
    }
    uVar20 = pTVar6->m_width;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&local_a8,(ulong)mipLevels);
    uVar14 = 1;
    if (mipLevels == 0) {
      uVar16 = 1;
      local_e0 = 1;
    }
    else {
      lVar21 = 0;
      uVar14 = 0;
      do {
        if (*(long *)(*(long *)&(pTVar6->super_TextureLevelPyramid).m_data.
                                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                ._M_impl + 8 + (long)(int)uVar14 * 0x10) != 0) {
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                     *)((long)&((local_a8.
                                 super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar21),
                    (value_type *)
                    ((long)(int)uVar14 * 0x28 +
                    *(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl));
        }
        uVar14 = uVar14 + 1;
        lVar21 = lVar21 + 0x18;
      } while (mipLevels != uVar14);
      uVar16 = 1;
      local_e0 = 1;
      uVar14 = 1;
    }
    break;
  case TYPE_2D:
    pTVar6 = (pTVar5->m_binding).tex1D;
    local_b8 = (pTVar6->super_TextureLevelPyramid).m_format;
    mipLevels = 1;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      mipLevels = (int)((ulong)((long)*(pointer *)
                                       ((long)&(pTVar6->super_TextureLevelPyramid).m_access + 8) -
                               *(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                         ._M_impl) >> 3) * -0x33333333;
    }
    uVar20 = pTVar6->m_width;
    uVar14 = *(uint *)&pTVar6->field_0x3c;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&local_a8,(ulong)mipLevels);
    if (mipLevels != 0) {
      lVar21 = 0;
      uVar16 = 0;
      do {
        if (*(long *)(*(long *)&(pTVar6->super_TextureLevelPyramid).m_data.
                                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                ._M_impl + 8 + (long)(int)uVar16 * 0x10) != 0) {
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                     *)((long)&((local_a8.
                                 super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar21),
                    (value_type *)
                    ((long)(int)uVar16 * 0x28 +
                    *(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl));
        }
        uVar16 = uVar16 + 1;
        lVar21 = lVar21 + 0x18;
      } while (mipLevels != uVar16);
    }
    local_e0 = 1;
    goto LAB_0067399b;
  case TYPE_3D:
    pTVar6 = (pTVar5->m_binding).tex1D;
    local_b8 = (pTVar6->super_TextureLevelPyramid).m_format;
    mipLevels = 1;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      mipLevels = (int)((ulong)((long)*(pointer *)
                                       ((long)&(pTVar6->super_TextureLevelPyramid).m_access + 8) -
                               *(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                         ._M_impl) >> 3) * -0x33333333;
    }
    uVar20 = pTVar6->m_width;
    uVar14 = *(uint *)&pTVar6->field_0x3c;
    uVar16 = (pTVar6->m_view).m_numLevels;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&local_a8,(ulong)mipLevels);
    local_e0 = 1;
    if (mipLevels != 0) {
      lVar21 = 0;
      uVar15 = 0;
      do {
        if (*(long *)(*(long *)&(pTVar6->super_TextureLevelPyramid).m_data.
                                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                ._M_impl + 8 + (long)(int)uVar15 * 0x10) != 0) {
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                     *)((long)&((local_a8.
                                 super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar21),
                    (value_type *)
                    ((long)(int)uVar15 * 0x28 +
                    *(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl));
        }
        uVar15 = uVar15 + 1;
        lVar21 = lVar21 + 0x18;
      } while (mipLevels != uVar15);
    }
    break;
  case TYPE_CUBE_MAP:
    pTVar6 = (pTVar5->m_binding).tex1D;
    local_b8 = (pTVar6->super_TextureLevelPyramid).m_format;
    mipLevels = 1;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      mipLevels = (int)((ulong)(*(long *)&pTVar6[2].super_TextureLevelPyramid.m_data.
                                          super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                          ._M_impl -
                               *(long *)&pTVar6[2].super_TextureLevelPyramid.m_format) >> 3) *
                  -0x33333333;
    }
    uVar20 = *(uint *)&(pTVar6->super_TextureLevelPyramid).m_data.
                       super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                       ._M_impl.super__Vector_impl_data;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&local_a8,(ulong)mipLevels);
    local_e0 = 6;
    dVar12 = local_e0;
    local_e0 = 6;
    if (mipLevels != 0) {
      uVar19 = 0;
      local_b0 = this;
      do {
        iVar13 = (int)uVar19;
        lVar21 = 0;
        do {
          if (*(long *)(*(long *)((long)&(pTVar6->super_TextureLevelPyramid).m_data +
                                 (ulong)*(uint *)((long)useSampler::cubeFaceMapping + lVar21) * 0x18
                                 + 8) + 8 + (long)iVar13 * 0x10) != 0) {
            std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
            push_back(local_a8.
                      super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19,
                      (value_type *)
                      (*(long *)((long)&pTVar6[2].super_TextureLevelPyramid.m_format +
                                (ulong)*(uint *)((long)useSampler::cubeFaceMapping + lVar21) * 0x18)
                      + (long)iVar13 * 0x28));
          }
          lVar21 = lVar21 + 4;
        } while (lVar21 != 0x18);
        uVar19 = (ulong)(iVar13 + 1U);
      } while (iVar13 + 1U != mipLevels);
      uVar16 = 1;
      this = local_b0;
      uVar14 = uVar20;
      break;
    }
    goto LAB_00673952;
  case TYPE_1D_ARRAY:
    pTVar6 = (pTVar5->m_binding).tex1D;
    local_b8 = (pTVar6->super_TextureLevelPyramid).m_format;
    mipLevels = 1;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      mipLevels = (int)((ulong)((long)*(pointer *)
                                       ((long)&(pTVar6->super_TextureLevelPyramid).m_access + 8) -
                               *(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                         ._M_impl) >> 3) * -0x33333333;
    }
    uVar20 = pTVar6->m_width;
    local_e0 = *(deUint32 *)&pTVar6->field_0x3c;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&local_a8,(ulong)mipLevels);
    if (mipLevels != 0) {
      uVar14 = 0;
      local_b0 = this;
      do {
        if (*(long *)(*(long *)&(pTVar6->super_TextureLevelPyramid).m_data.
                                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                ._M_impl + 8 + (long)(int)uVar14 * 0x10) != 0) {
          pTVar1 = (TextureFormat *)
                   (*(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl + (long)(int)uVar14 * 0x28);
          CVar3 = pTVar1[1].order;
          iVar13 = tcu::TextureFormat::getPixelSize(pTVar1);
          if (local_e0 != 0) {
            uVar17 = 0;
            uVar19 = (ulong)local_e0;
            do {
              tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                        (&local_58,pTVar1,pTVar1[1].order,1,1,(void *)(uVar17 + (long)pTVar1[4]));
              std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ::push_back(local_a8.
                          super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar14,&local_58);
              uVar17 = (ulong)((int)uVar17 + CVar3 * iVar13);
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != mipLevels);
      uVar16 = 1;
      this = local_b0;
      uVar14 = 1;
      break;
    }
    uVar14 = 1;
LAB_0067399b:
    uVar16 = 1;
    this = this;
    break;
  case TYPE_2D_ARRAY:
    pTVar6 = (pTVar5->m_binding).tex1D;
    local_b8 = (pTVar6->super_TextureLevelPyramid).m_format;
    mipLevels = 1;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      mipLevels = (int)((ulong)((long)*(pointer *)
                                       ((long)&(pTVar6->super_TextureLevelPyramid).m_access + 8) -
                               *(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                         ._M_impl) >> 3) * -0x33333333;
    }
    uVar20 = pTVar6->m_width;
    uVar14 = *(uint *)&pTVar6->field_0x3c;
    local_e0 = (pTVar6->m_view).m_numLevels;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&local_a8,(ulong)mipLevels);
    if (mipLevels != 0) {
      uVar16 = 0;
      local_b0 = this;
      do {
        if (*(long *)(*(long *)&(pTVar6->super_TextureLevelPyramid).m_data.
                                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                ._M_impl + 8 + (long)(int)uVar16 * 0x10) != 0) {
          pTVar1 = (TextureFormat *)
                   (*(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl + (long)(int)uVar16 * 0x28);
          CVar3 = pTVar1[1].order;
          CVar4 = pTVar1[1].type;
          iVar13 = tcu::TextureFormat::getPixelSize(pTVar1);
          if (local_e0 != 0) {
            uVar15 = 0;
            uVar19 = (ulong)local_e0;
            do {
              tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                        (&local_58,pTVar1,pTVar1[1].order,pTVar1[1].type,1,
                         (void *)((ulong)uVar15 + (long)pTVar1[4]));
              std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ::push_back(local_a8.
                          super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar16,&local_58);
              uVar15 = uVar15 + CVar4 * CVar3 * iVar13;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
        }
        uVar16 = uVar16 + 1;
        this = local_b0;
      } while (uVar16 != mipLevels);
    }
    uVar16 = 1;
    break;
  case TYPE_CUBE_ARRAY:
    pTVar6 = (pTVar5->m_binding).tex1D;
    local_b8 = (pTVar6->super_TextureLevelPyramid).m_format;
    mipLevels = 1;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      mipLevels = (int)((ulong)((long)*(pointer *)
                                       ((long)&(pTVar6->super_TextureLevelPyramid).m_access + 8) -
                               *(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                         ._M_impl) >> 3) * -0x33333333;
    }
    uVar20 = pTVar6->m_width;
    local_e0 = *(deUint32 *)&pTVar6->field_0x3c;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&local_a8,(ulong)mipLevels);
    dVar12 = local_e0;
    if (mipLevels != 0) {
      uVar14 = 0;
      local_b0 = this;
      do {
        if (*(long *)(*(long *)&(pTVar6->super_TextureLevelPyramid).m_data.
                                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                ._M_impl + 8 + (long)(int)uVar14 * 0x10) != 0) {
          pTVar1 = (TextureFormat *)
                   (*(long *)&(pTVar6->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl + (long)(int)uVar14 * 0x28);
          CVar3 = pTVar1[1].order;
          CVar4 = pTVar1[1].type;
          iVar13 = tcu::TextureFormat::getPixelSize(pTVar1);
          if (local_e0 != 0) {
            uVar16 = 0;
            uVar19 = (ulong)local_e0;
            do {
              tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                        (&local_58,pTVar1,pTVar1[1].order,pTVar1[1].type,1,
                         (void *)((ulong)uVar16 + (long)pTVar1[4]));
              std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ::push_back(local_a8.
                          super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar14,&local_58);
              uVar16 = uVar16 + CVar4 * CVar3 * iVar13;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != mipLevels);
      uVar16 = 1;
      this = local_b0;
      uVar14 = uVar20;
      break;
    }
LAB_00673952:
    local_e0 = dVar12;
    uVar16 = 1;
    this = this;
    uVar14 = uVar20;
    break;
  default:
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"Invalid texture type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x7c8);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  pPVar18 = &pTVar5->m_params;
  local_88._0_4_ = pPVar18->baseMipLevel;
  local_88._4_4_ = (pPVar18->componentMapping).r;
  uVar7 = *(undefined8 *)((long)&(pTVar5->m_params).componentMapping + 8);
  uVar8 = pPVar18->baseMipLevel;
  uVar9 = (pPVar18->componentMapping).r;
  uVar10 = (pPVar18->componentMapping).g;
  uVar11 = (pPVar18->componentMapping).b;
  textureParams.componentMapping.b = uVar11;
  textureParams.componentMapping.g = uVar10;
  textureParams.componentMapping.r = uVar9;
  textureParams.baseMipLevel = uVar8;
  uStack_74._0_4_ = (pTVar5->m_params).samples;
  uStack_74._4_4_ = (pTVar5->m_params).initialization;
  uStack_80 = (undefined4)*(undefined8 *)((long)&(pTVar5->m_params).componentMapping + 4);
  uStack_7c = (undefined4)uVar7;
  uStack_78 = (undefined4)((ulong)uVar7 >> 0x20);
  textureParams.componentMapping.a = uStack_78;
  textureParams.samples = (undefined4)uStack_74;
  textureParams.initialization = uStack_74._4_4_;
  local_64.m_data[0] = uVar20;
  local_64.m_data[1] = uVar14;
  local_64.m_data[2] = uVar16;
  createSamplerUniform
            (this,bindingLocation,textureType,(pTVar5->m_params).initialization,&local_b8,&local_64,
             &local_a8,&pTVar5->m_sampler,mipLevels,local_e0,textureParams);
  std::
  vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

void ShaderRenderCaseInstance::useSampler (deUint32 bindingLocation, deUint32 textureId)
{
	DE_ASSERT(textureId < m_textures.size());

	const TextureBinding&				textureBinding		= *m_textures[textureId];
	const TextureBinding::Type			textureType			= textureBinding.getType();
	const tcu::Sampler&					refSampler			= textureBinding.getSampler();
	const TextureBinding::Parameters&	textureParams		= textureBinding.getParameters();
	const bool							isMSTexture			= textureParams.samples != vk::VK_SAMPLE_COUNT_1_BIT;
	deUint32							mipLevels			= 1u;
	deUint32							arrayLayers			= 1u;
	tcu::TextureFormat					texFormat;
	tcu::UVec3							texSize;
	TextureData							textureData;

	if (textureType == TextureBinding::TYPE_2D)
	{
		const tcu::Texture2D&			texture		= textureBinding.get2D();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), texture.getHeight(), 1u);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 1u;

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			textureData[level].push_back(texture.getLevel(level));
		}
	}
	else if (textureType == TextureBinding::TYPE_CUBE_MAP)
	{
		const tcu::TextureCube&			texture		= textureBinding.getCube();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getSize(), texture.getSize(), 1u);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 6u;

		static const tcu::CubeFace		cubeFaceMapping[tcu::CUBEFACE_LAST] =
		{
			tcu::CUBEFACE_POSITIVE_X,
			tcu::CUBEFACE_NEGATIVE_X,
			tcu::CUBEFACE_POSITIVE_Y,
			tcu::CUBEFACE_NEGATIVE_Y,
			tcu::CUBEFACE_POSITIVE_Z,
			tcu::CUBEFACE_NEGATIVE_Z
		};

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; ++faceNdx)
			{
				tcu::CubeFace face = cubeFaceMapping[faceNdx];

				if (texture.isLevelEmpty(face, level))
					continue;

				textureData[level].push_back(texture.getLevelFace(level, face));
			}
		}
	}
	else if (textureType == TextureBinding::TYPE_2D_ARRAY)
	{
		const tcu::Texture2DArray&		texture		= textureBinding.get2DArray();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), texture.getHeight(), 1u);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= (deUint32)texture.getNumLayers();

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			const tcu::ConstPixelBufferAccess&	levelLayers		= texture.getLevel(level);
			const deUint32						layerSize		= levelLayers.getWidth() * levelLayers.getHeight() * levelLayers.getFormat().getPixelSize();

			for (deUint32 layer = 0; layer < arrayLayers; ++layer)
			{
				const deUint32					layerOffset		= layerSize * layer;
				tcu::ConstPixelBufferAccess		layerData		(levelLayers.getFormat(), levelLayers.getWidth(), levelLayers.getHeight(), 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
				textureData[level].push_back(layerData);
			}
		}
	}
	else if (textureType == TextureBinding::TYPE_3D)
	{
		const tcu::Texture3D&			texture		= textureBinding.get3D();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), texture.getHeight(), texture.getDepth());
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 1u;

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			textureData[level].push_back(texture.getLevel(level));
		}
	}
	else if (textureType == TextureBinding::TYPE_1D)
	{
		const tcu::Texture1D&			texture		= textureBinding.get1D();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), 1, 1);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 1u;

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			textureData[level].push_back(texture.getLevel(level));
		}
	}
	else if (textureType == TextureBinding::TYPE_1D_ARRAY)
	{
		const tcu::Texture1DArray&		texture		= textureBinding.get1DArray();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), 1, 1);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= (deUint32)texture.getNumLayers();

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			const tcu::ConstPixelBufferAccess&	levelLayers		= texture.getLevel(level);
			const deUint32						layerSize		= levelLayers.getWidth() * levelLayers.getFormat().getPixelSize();

			for (deUint32 layer = 0; layer < arrayLayers; ++layer)
			{
				const deUint32					layerOffset		= layerSize * layer;
				tcu::ConstPixelBufferAccess		layerData		(levelLayers.getFormat(), levelLayers.getWidth(), 1, 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
				textureData[level].push_back(layerData);
			}
		}
	}
	else if (textureType == TextureBinding::TYPE_CUBE_ARRAY)
	{
		const tcu::TextureCubeArray&	texture		= textureBinding.getCubeArray();
		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getSize(), texture.getSize(), 1);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= texture.getDepth();

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			const tcu::ConstPixelBufferAccess&	levelLayers		= texture.getLevel(level);
			const deUint32						layerSize		= levelLayers.getWidth() * levelLayers.getHeight() * levelLayers.getFormat().getPixelSize();

			for (deUint32 layer = 0; layer < arrayLayers; ++layer)
			{
				const deUint32					layerOffset		= layerSize * layer;
				tcu::ConstPixelBufferAccess		layerData		(levelLayers.getFormat(), levelLayers.getWidth(), levelLayers.getHeight(), 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
				textureData[level].push_back(layerData);
			}
		}
	}
	else
	{
		TCU_THROW(InternalError, "Invalid texture type");
	}

	createSamplerUniform(bindingLocation, textureType, textureBinding.getParameters().initialization, texFormat, texSize, textureData, refSampler, mipLevels, arrayLayers, textureParams);
}